

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int av1_handle_inter_intra_mode
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MB_MODE_INFO *mbmi,
              HandleInterModeArgs *args,int64_t ref_best_rd,int *rate_mv,int *tmp_rate2,
              BUFFER_SET *orig_dst)

{
  _Bool _Var1;
  byte bVar2;
  uint8_t uVar3;
  _Bool _Var4;
  uint uVar5;
  macroblockd_plane *pmVar6;
  MACROBLOCK *x_00;
  MB_MODE_INFO *pMVar7;
  long lVar8;
  uint8_t *puVar9;
  int64_t iVar10;
  MACROBLOCK *pMVar11;
  MACROBLOCK *pMVar12;
  ulong uVar13;
  int iVar14;
  MV MVar15;
  undefined7 in_register_00000011;
  long lVar16;
  INTERINTRA_MODE cur_mode_1;
  int iVar17;
  long lVar18;
  uint uVar19;
  BUFFER_SET *pBVar20;
  uint dst_stride;
  INTERINTRA_MODE cur_mode;
  buf_2d *pbVar21;
  int bw;
  uint8_t skip_txfm_sb_1;
  int tmp_rate_mv;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int_mv tmp_mv;
  int rate;
  int64_t rd_thresh;
  RD_STATS rd_stats;
  int64_t skip_sse_sb;
  uint8_t intrapred_ [2048];
  uint8_t tmp_buf_ [2048];
  int64_t *in_stack_ffffffffffffeee8;
  byte local_1109;
  undefined1 local_1101;
  MACROBLOCK *local_1100;
  int local_10f4;
  MACROBLOCK *local_10f0;
  MB_MODE_INFO *local_10e8;
  uint8_t *local_10e0;
  AV1_COMMON *local_10d8;
  int (*local_10d0) [4];
  uint8_t *local_10c8;
  MV local_10c0;
  int local_10bc;
  long local_10b8;
  ulong local_10b0;
  HandleInterModeArgs *local_10a8;
  long local_10a0;
  int (*local_1098) [4];
  MV local_108c;
  int local_1088;
  int local_1084;
  ulong local_1080;
  AV1_COMP *local_1078;
  uint8_t *local_1070;
  RD_STATS local_1068;
  uint8_t local_1040 [8];
  uint8_t local_1038 [2048];
  uint8_t local_838 [2056];
  
  local_10b0 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  iVar14 = *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                   (ulong)(uint)((int)CONCAT71(in_register_00000011,bsize) << 5));
  local_10a0 = CONCAT44(local_10a0._4_4_,iVar14);
  if ((iVar14 < 1) ||
     (uVar5 = (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh, x->source_variance <= uVar5))
  {
    local_1080 = 0;
  }
  else {
    local_1080 = (ulong)CONCAT31((int3)(uVar5 >> 8),
                                 (cpi->oxcf).comp_type_cfg.enable_interintra_wedge);
  }
  _Var1 = (cpi->oxcf).comp_type_cfg.enable_smooth_interintra;
  local_10d8 = &cpi->common;
  local_10f0 = (MACROBLOCK *)&x->e_mbd;
  bVar2 = block_size_wide[local_10b0];
  uVar5 = ((x->e_mbd).cur_buf)->flags;
  local_1070 = (uint8_t *)((ulong)local_838 >> 1);
  if ((uVar5 & 8) == 0) {
    local_1070 = local_838;
  }
  local_10c8 = (uint8_t *)((ulong)local_1038 >> 1);
  local_1084 = (x->e_mbd).mi_row;
  local_1088 = (x->e_mbd).mi_col;
  mbmi->ref_frame[1] = -1;
  pmVar6 = (x->e_mbd).plane;
  (x->e_mbd).plane[0].dst.buf = local_1070;
  dst_stride = (uint)bVar2;
  (x->e_mbd).plane[0].dst.stride = dst_stride;
  uVar19 = (uint)bsize;
  local_10e8 = mbmi;
  local_10b8 = ref_best_rd;
  local_10a8 = args;
  av1_enc_build_inter_predictor
            (local_10d8,(MACROBLOCKD *)local_10f0,local_1084,local_1088,(BUFFER_SET *)0x0,bsize,0,0)
  ;
  uVar3 = ((cpi->common).seq_params)->monochrome;
  local_1068._32_8_ = *(undefined8 *)(orig_dst->stride + 2);
  local_1068.rdcost = (int64_t)orig_dst->plane[2];
  local_1068.sse = *(int64_t *)orig_dst->stride;
  local_1068._0_8_ = orig_dst->plane[0];
  local_1068.dist = (int64_t)orig_dst->plane[1];
  lVar8 = 6;
  do {
    pbVar21 = &pmVar6->dst;
    pbVar21->buf = (uint8_t *)(&local_1098)[lVar8];
    pbVar21->stride = (&local_1068.rate)[lVar8];
    lVar18 = (-(ulong)(uVar3 != '\0') | 0xfffffffffffffffd) + lVar8;
    lVar8 = lVar8 + 1;
    pmVar6 = (macroblockd_plane *)(pbVar21 + 0x51);
  } while (lVar18 != 5);
  puVar9 = local_10c8;
  if ((uVar5 & 8) == 0) {
    puVar9 = local_1038;
  }
  local_10e8->ref_frame[1] = '\0';
  local_1109 = local_10a8->inter_intra_mode[local_10e8->ref_frame[0]];
  local_10e0 = puVar9;
  if (_Var1 == false) {
    local_10a0 = 0x7fffffff;
    lVar8 = 0x7fffffffffffffff;
    uVar13 = local_10b0;
LAB_003ba3e4:
    puVar9 = local_10e0;
    local_10c0 = (MV)local_10e8->mv[0].as_int;
    local_10f4 = 0;
    iVar14 = 0;
    if ((byte)local_1080 == '\0') {
      lVar18 = 0x7fffffffffffffff;
      MVar15 = local_10c0;
    }
    else {
      bVar2 = ""[uVar13];
      _Var4 = (cpi->oxcf).comp_type_cfg.enable_smooth_interintra;
      *(ushort *)&local_10e8->field_0xa7 = *(ushort *)&local_10e8->field_0xa7 | 0x400;
      local_10d0 = (x->mode_costs).interintra_mode_cost + bVar2;
      local_10b8 = lVar8;
      local_108c = local_10c0;
      if ((cpi->sf).inter_sf.fast_interintra_wedge_search == 0) {
        if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
          local_10c8 = local_1038;
        }
        local_1098 = (int (*) [4])0x0;
        lVar8 = 0x7fffffffffffffff;
        local_10a8 = (HandleInterModeArgs *)0x0;
        lVar18 = 0;
        local_1100 = (MACROBLOCK *)0x7fffffffffffffff;
        do {
          local_10e8->interintra_mode = (INTERINTRA_MODE)lVar18;
          pBVar20 = orig_dst;
          av1_build_intra_predictors_for_interintra
                    (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,local_10c8,dst_stride);
          pMVar11 = (MACROBLOCK *)
                    pick_interintra_wedge
                              ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                               local_838,(uint8_t *)pBVar20);
          puVar9 = local_10e0;
          lVar16 = (long)&pMVar11->plane[0].src_diff +
                   ((long)x->rdmult *
                    ((long)*(int *)((long)(x->mode_costs).wedge_idx_cost[0] +
                                   (long)local_10e8->interintra_wedge_index * 4 +
                                   (ulong)(uint)((int)uVar13 << 6)) + (long)(*local_10d0)[lVar18]) +
                    0x100 >> 9);
          if (lVar16 < lVar8) {
            local_1098 = (int (*) [4])(ulong)local_10e8->interintra_mode;
            lVar8 = lVar16;
            local_1100 = pMVar11;
            local_10a8 = (HandleInterModeArgs *)(long)local_10e8->interintra_wedge_index;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        local_10e8->interintra_mode = (INTERINTRA_MODE)local_1098;
        local_10e8->interintra_wedge_index = (int8_t)local_10a8;
        uVar13 = local_10b0;
        pMVar11 = local_1100;
        if ((int)local_1098 != 3) {
          av1_build_intra_predictors_for_interintra
                    (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,local_10e0,dst_stride);
          uVar13 = local_10b0;
          pMVar11 = local_1100;
        }
      }
      else if (_Var4 == false) {
        if (local_1109 == 4) {
          local_10e8->interintra_mode = '\x03';
          lVar8 = 0;
          pBVar20 = orig_dst;
          local_1078 = cpi;
          av1_build_intra_predictors_for_interintra
                    (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,local_10e0,dst_stride);
          local_1100 = x;
          pMVar11 = (MACROBLOCK *)
                    pick_interintra_wedge
                              ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                               local_838,(uint8_t *)pBVar20);
          x_00 = local_10f0;
          local_1109 = 3;
          do {
            puVar9 = local_10e0;
            local_10e8->interintra_mode = (INTERINTRA_MODE)lVar8;
            local_10c8 = (uint8_t *)(long)(*local_10d0)[lVar8];
            av1_build_intra_predictors_for_interintra
                      (local_10d8,(MACROBLOCKD *)x_00,bsize,0,orig_dst,local_10e0,dst_stride);
            av1_combine_interintra
                      ((MACROBLOCKD *)x_00,bsize,0,local_1070,dst_stride,puVar9,dst_stride);
            pMVar12 = local_1100;
            model_rd_for_sb_with_curvfit
                      ((AV1_COMP *)(ulong)uVar19,(BLOCK_SIZE)local_1100,x_00,(MACROBLOCKD *)0x0,0,
                       (int)&local_10bc,&local_1068.rate,(int64_t *)&local_1101,local_1040,
                       (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeee8);
            puVar9 = local_10e0;
            pMVar12 = (MACROBLOCK *)
                      (local_1068._0_8_ * 0x80 +
                      ((long)pMVar12->rdmult * ((long)local_10bc + (long)local_10c8) + 0x100 >> 9));
            if ((long)pMVar12 < (long)pMVar11) {
              local_1109 = local_10e8->interintra_mode;
              pMVar11 = pMVar12;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_10a8->inter_intra_mode[local_10e8->ref_frame[0]] = local_1109;
          local_10e8->interintra_mode = local_1109;
          if (local_1109 == 3) {
            local_1109 = 3;
            uVar13 = local_10b0;
            x = local_1100;
            cpi = local_1078;
          }
          else {
            av1_build_intra_predictors_for_interintra
                      (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,local_10e0,dst_stride);
            uVar13 = local_10b0;
            x = local_1100;
            cpi = local_1078;
          }
        }
        else {
          local_10e8->interintra_mode = local_1109;
          pBVar20 = orig_dst;
          av1_build_intra_predictors_for_interintra
                    (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,local_10e0,dst_stride);
          pMVar11 = (MACROBLOCK *)
                    pick_interintra_wedge
                              ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                               local_838,(uint8_t *)pBVar20);
        }
      }
      else {
        pMVar11 = (MACROBLOCK *)
                  pick_interintra_wedge
                            ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                             local_838,(uint8_t *)0x0);
        puVar9 = local_10e0;
      }
      local_10d0 = (int (*) [4])
                   ((long)(x->mode_costs).wedge_interintra_cost[uVar13][1] +
                   (long)*(int *)((long)(x->mode_costs).wedge_idx_cost[0] +
                                 (long)local_10e8->interintra_wedge_index * 4 +
                                 (ulong)(uint)((int)uVar13 << 6)) +
                   (long)(*local_10d0)[local_10e8->interintra_mode]);
      local_10c8 = (uint8_t *)
                   ((long)&pMVar11->plane[0].src_diff +
                   ((long)x->rdmult * ((long)*rate_mv + (long)local_10d0) + 0x100 >> 9));
      MVar15 = (MV)local_10e8->mv[0].as_int;
      if ((local_10e8->mode < 0x19) && ((0x1790000U >> (local_10e8->mode & 0x1f) & 1) != 0)) {
        local_1100 = (MACROBLOCK *)CONCAT44(local_1100._4_4_,MVar15);
        av1_compound_single_motion_search
                  (cpi,x,bsize,&local_10c0,puVar9,
                   *(uint8_t **)
                    (*(long *)((long)&av1_wedge_params_lookup[0].masks +
                              (ulong)(uint)((int)uVar13 << 5)) + 0x80 +
                    (long)local_10e8->interintra_wedge_index * 8),dst_stride,&local_10f4,0);
        pMVar7 = local_10e8;
        pMVar11 = local_10f0;
        if ((MV)local_10e8->mv[0].as_int == local_10c0) {
          MVar15 = local_1100._0_4_;
          goto LAB_003baa41;
        }
        local_10e8->mv[0].as_int = (uint32_t)local_10c0;
        local_10e8->ref_frame[1] = -1;
        av1_enc_build_inter_predictor
                  (local_10d8,(MACROBLOCKD *)local_10f0,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst
                   ,bsize,0,0);
        pMVar7->ref_frame[1] = '\0';
        av1_combine_interintra
                  ((MACROBLOCKD *)pMVar11,bsize,0,(x->e_mbd).plane[0].dst.buf,
                   (x->e_mbd).plane[0].dst.stride,local_10e0,dst_stride);
        model_rd_for_sb_with_curvfit
                  ((AV1_COMP *)(ulong)uVar19,(BLOCK_SIZE)x,pMVar11,(MACROBLOCKD *)0x0,0,
                   (int)&local_10bc,&local_1068.rate,(int64_t *)&local_1101,local_1040,
                   (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeee8);
        uVar13 = (long)(int)local_10d0 + (long)local_10f4;
        lVar8 = (long)x->rdmult;
        puVar9 = local_10e0;
        MVar15 = local_1100._0_4_;
        if ((long)local_10c8 <=
            local_1068._0_8_ * 0x80 + ((long)(((long)local_10bc + uVar13) * lVar8 + 0x100) >> 9))
        goto LAB_003baa41;
      }
      else {
LAB_003baa41:
        local_10f4 = *rate_mv;
        local_10c0 = MVar15;
        av1_combine_interintra
                  ((MACROBLOCKD *)local_10f0,bsize,0,local_1070,dst_stride,puVar9,dst_stride);
        lVar8 = (long)x->rdmult;
        uVar13 = (ulong)(uint)(local_10f4 + (int)local_10d0);
      }
      iVar10 = estimate_yrd_for_sb(cpi,bsize,x,local_10b8 - ((int)uVar13 * lVar8 + 0x100 >> 9),
                                   &local_1068);
      iVar14 = (int)local_10d0;
      lVar8 = local_10b8;
      MVar15 = local_108c;
      if (iVar10 == 0x7fffffffffffffff) {
        lVar18 = 0x7fffffffffffffff;
        if (local_10c8 == (uint8_t *)0x7fffffffffffffff) goto LAB_003baadc;
      }
      else {
        lVar18 = local_1068.dist * 0x80 +
                 ((long)x->rdmult * ((long)local_1068.rate + (long)local_10f4 + (long)iVar14) +
                  0x100 >> 9);
      }
    }
    if ((lVar8 != 0x7fffffffffffffff) || (iVar17 = -1, lVar18 != 0x7fffffffffffffff)) {
      if (lVar18 < lVar8) {
        local_10e8->mv[0].as_int = (uint32_t)local_10c0;
        *tmp_rate2 = *tmp_rate2 + (local_10f4 - *rate_mv);
        *rate_mv = local_10f4;
      }
      else {
        if ((_Var1 & (byte)local_1080) == 1) {
          local_10e8->field_0xa8 = local_10e8->field_0xa8 & 0xfb;
          local_10e8->interintra_mode = local_1109;
          local_10e8->mv[0].as_int = (uint32_t)MVar15;
          av1_enc_build_inter_predictor
                    (local_10d8,(MACROBLOCKD *)local_10f0,local_1084,local_1088,orig_dst,bsize,0,0);
        }
        iVar14 = (int)local_10a0;
      }
      *tmp_rate2 = *tmp_rate2 + iVar14;
      iVar17 = 0;
      if (uVar3 == '\0') {
        av1_enc_build_inter_predictor
                  (local_10d8,(MACROBLOCKD *)local_10f0,local_1084,local_1088,orig_dst,bsize,1,2);
      }
    }
  }
  else {
    bVar2 = ""[local_10b0];
    local_10e8->field_0xa8 = local_10e8->field_0xa8 & 0xfb;
    local_1098 = (x->mode_costs).interintra_mode_cost + bVar2;
    if (((cpi->sf).inter_sf.reuse_inter_intra_mode == 0) || (local_1109 == 4)) {
      lVar8 = 0;
      local_1100 = (MACROBLOCK *)0x7fffffffffffffff;
      local_1078 = cpi;
      do {
        pMVar11 = local_10f0;
        if ((local_1078->oxcf).intra_mode_cfg.enable_smooth_intra == true) {
          if ((lVar8 == 3) && ((local_1078->sf).intra_sf.disable_smooth_intra != 0)) break;
        }
        else if (lVar8 == 3) break;
        local_10e8->interintra_mode = (INTERINTRA_MODE)lVar8;
        local_10d0 = (int (*) [4])(long)(*local_1098)[lVar8];
        av1_build_intra_predictors_for_interintra
                  (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,puVar9,dst_stride);
        av1_combine_interintra
                  ((MACROBLOCKD *)pMVar11,bsize,0,local_1070,dst_stride,puVar9,dst_stride);
        model_rd_for_sb_with_curvfit
                  ((AV1_COMP *)(ulong)uVar19,(BLOCK_SIZE)x,pMVar11,(MACROBLOCKD *)0x0,0,
                   (int)&local_10bc,&local_1068.rate,(int64_t *)&local_10c0,local_1040,
                   (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeee8);
        pMVar11 = (MACROBLOCK *)
                  (local_1068._0_8_ * 0x80 +
                  ((long)x->rdmult * ((long)local_10bc + (long)local_10d0) + 0x100 >> 9));
        if ((long)pMVar11 < (long)local_1100) {
          local_1109 = local_10e8->interintra_mode;
          local_1100 = pMVar11;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      local_10a8->inter_intra_mode[local_10e8->ref_frame[0]] = local_1109;
      cpi = local_1078;
    }
    puVar9 = local_10e0;
    pMVar11 = local_10f0;
    local_10e8->interintra_mode = local_1109;
    av1_build_intra_predictors_for_interintra
              (local_10d8,(MACROBLOCKD *)local_10f0,bsize,0,orig_dst,local_10e0,dst_stride);
    av1_combine_interintra((MACROBLOCKD *)pMVar11,bsize,0,local_1070,dst_stride,puVar9,dst_stride);
    uVar13 = local_10b0;
    iVar14 = 0;
    if (0 < (int)local_10a0) {
      iVar14 = (x->mode_costs).wedge_interintra_cost[local_10b0][0];
    }
    local_10a0 = (long)iVar14 + (long)(*local_1098)[local_1109];
    lVar18 = *rate_mv + local_10a0;
    lVar8 = 0x7fffffffffffffff;
    if (local_10b8 < 0x47fffffffffffff7) {
      lVar8 = (local_10b8 / 9) * 0x10;
    }
    iVar10 = estimate_yrd_for_sb(cpi,bsize,x,lVar8 - (x->rdmult * lVar18 + 0x100 >> 9),&local_1068);
    if (iVar10 != 0x7fffffffffffffff) {
      lVar8 = local_1068.dist * 0x80 +
              ((long)x->rdmult * ((long)(int)lVar18 + (long)local_1068.rate) + 0x100 >> 9);
      if ((local_10b8 == 0x7fffffffffffffff) || ((lVar8 >> 4) * 9 <= local_10b8)) goto LAB_003ba3e4;
    }
LAB_003baadc:
    iVar17 = -1;
  }
  return iVar17;
}

Assistant:

int av1_handle_inter_intra_mode(const AV1_COMP *const cpi, MACROBLOCK *const x,
                                BLOCK_SIZE bsize, MB_MODE_INFO *mbmi,
                                HandleInterModeArgs *args, int64_t ref_best_rd,
                                int *rate_mv, int *tmp_rate2,
                                const BUFFER_SET *orig_dst) {
  const int try_smooth_interintra =
      cpi->oxcf.comp_type_cfg.enable_smooth_interintra;

  const int is_wedge_used = av1_is_wedge_used(bsize);
  const int try_wedge_interintra =
      is_wedge_used && enable_wedge_interintra_search(x, cpi);

  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int bw = block_size_wide[bsize];
  DECLARE_ALIGNED(16, uint8_t, tmp_buf_[2 * MAX_INTERINTRA_SB_SQUARE]);
  DECLARE_ALIGNED(16, uint8_t, intrapred_[2 * MAX_INTERINTRA_SB_SQUARE]);
  uint8_t *tmp_buf = get_buf_by_bd(xd, tmp_buf_);
  uint8_t *intrapred = get_buf_by_bd(xd, intrapred_);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Single reference inter prediction
  mbmi->ref_frame[1] = NONE_FRAME;
  xd->plane[0].dst.buf = tmp_buf;
  xd->plane[0].dst.stride = bw;
  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);
  const int num_planes = av1_num_planes(cm);

  // Restore the buffers for intra prediction
  restore_dst_buf(xd, *orig_dst, num_planes);
  mbmi->ref_frame[1] = INTRA_FRAME;
  INTERINTRA_MODE best_interintra_mode =
      args->inter_intra_mode[mbmi->ref_frame[0]];

  // Compute smooth_interintra
  int64_t best_interintra_rd_nowedge = INT64_MAX;
  int best_mode_rate = INT_MAX;
  if (try_smooth_interintra) {
    int ret = handle_smooth_inter_intra_mode(
        cpi, x, bsize, mbmi, ref_best_rd, rate_mv, &best_interintra_mode,
        &best_interintra_rd_nowedge, &best_mode_rate, orig_dst, tmp_buf,
        intrapred, args);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  // Compute wedge interintra
  int64_t best_interintra_rd_wedge = INT64_MAX;
  const int_mv mv0 = mbmi->mv[0];
  int_mv tmp_mv = mv0;
  int tmp_rate_mv = 0;
  int rate_overhead = 0;
  if (try_wedge_interintra) {
    int ret = handle_wedge_inter_intra_mode(
        cpi, x, bsize, mbmi, rate_mv, &best_interintra_mode,
        &best_interintra_rd_wedge, orig_dst, tmp_buf_, tmp_buf, intrapred_,
        intrapred, args, &tmp_rate_mv, &rate_overhead, &tmp_mv,
        best_interintra_rd_nowedge);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  if (best_interintra_rd_nowedge == INT64_MAX &&
      best_interintra_rd_wedge == INT64_MAX) {
    return IGNORE_MODE;
  }
  if (best_interintra_rd_wedge < best_interintra_rd_nowedge) {
    mbmi->mv[0].as_int = tmp_mv.as_int;
    *tmp_rate2 += tmp_rate_mv - *rate_mv;
    *rate_mv = tmp_rate_mv;
    best_mode_rate = rate_overhead;
  } else if (try_smooth_interintra && try_wedge_interintra) {
    // If smooth was best, but we over-wrote the values when evaluating the
    // wedge mode, we need to recompute the smooth values.
    mbmi->use_wedge_interintra = 0;
    mbmi->interintra_mode = best_interintra_mode;
    mbmi->mv[0].as_int = mv0.as_int;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  *tmp_rate2 += best_mode_rate;

  if (num_planes > 1) {
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_U, num_planes - 1);
  }
  return 0;
}